

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2vd_parser.c
# Opt level: O0

MPP_RET m2vd_convert_to_dxva(M2VDParserContext *p)

{
  RK_S32 RVar1;
  RK_U32 RVar2;
  RK_U32 RVar3;
  MppFrame local_68;
  MppFrame frame_1;
  MppFrame frame;
  MppFrame frame1;
  MppFrame frame0;
  uint local_40;
  RK_S32 readbits;
  RK_U32 error_info;
  RK_U32 i;
  BitReadCtx_t *bx;
  M2VDFrameHead *pbw;
  M2VDFrameHead *pfw;
  M2VDDxvaParam *dst;
  M2VDParserContext *pMStack_10;
  MPP_RET ret;
  M2VDParserContext *p_local;
  
  dst._4_4_ = MPP_OK;
  pMStack_10 = p;
  if ((m2vd_debug & 1) != 0) {
    _mpp_log_l(4,"m2vd_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_I",0x539,
               "m2vd_convert_to_dxva");
  }
  pfw = (M2VDFrameHead *)pMStack_10->dxva_ctx;
  pbw = pMStack_10->frame_ref1;
  bx = (BitReadCtx_t *)pMStack_10->frame_ref0;
  _error_info = pMStack_10->bitread_ctx;
  readbits = 0;
  local_40 = 0;
  frame0._4_4_ = m2vd_get_readbits(_error_info);
  pfw->qp = (pMStack_10->seq_head).decode_width;
  pfw->frame_codelen = (pMStack_10->seq_head).decode_height;
  *(RK_S32 *)&pfw->field_0x2c = (pMStack_10->seq_head).aspect_ratio_information;
  *(RK_S32 *)&pfw->f = (pMStack_10->seq_head).frame_rate_code;
  *(RK_S32 *)((long)&pfw->f + 4) = (pMStack_10->seq_head).bit_rate_value;
  pfw->flags = (pMStack_10->seq_head).vbv_buffer_size;
  pfw->slot_index = (pMStack_10->seq_head).constrained_parameters_flag;
  pfw[1].frameNumber = (pMStack_10->seq_head).load_intra_quantizer_matrix;
  pfw[1].tr = (pMStack_10->seq_head).load_non_intra_quantizer_matrix;
  pfw[1].picCodingType = (pMStack_10->seq_ext_head).profile_and_level_indication;
  pfw[1].totalMbInFrame = (pMStack_10->seq_ext_head).progressive_sequence;
  pfw[1].frameWidth = (pMStack_10->seq_ext_head).chroma_format;
  pfw[1].frameHeight = (pMStack_10->seq_ext_head).low_delay;
  pfw[1].mb_width = (pMStack_10->seq_ext_head).frame_rate_extension_n;
  pfw[1].mb_height = (pMStack_10->seq_ext_head).frame_rate_extension_d;
  pfw[1].vlcSet = (pMStack_10->gop_head).drop_flag;
  pfw[1].qp = (pMStack_10->gop_head).hour;
  pfw[1].frame_codelen = (pMStack_10->gop_head).minute;
  *(RK_S32 *)&pfw[1].field_0x2c = (pMStack_10->gop_head).sec;
  *(RK_S32 *)&pfw[1].f = (pMStack_10->gop_head).frame;
  *(RK_S32 *)((long)&pfw[1].f + 4) = (pMStack_10->gop_head).closed_gop;
  pfw[1].flags = (pMStack_10->gop_head).broken_link;
  pfw[1].slot_index = (pMStack_10->pic_head).temporal_reference;
  pfw[2].frameNumber = (pMStack_10->pic_head).picture_coding_type;
  pfw[2].tr = (pMStack_10->pic_head).pre_picture_coding_type;
  pfw[2].picCodingType = (pMStack_10->pic_head).vbv_delay;
  pfw[2].totalMbInFrame = (pMStack_10->pic_head).full_pel_forward_vector;
  pfw[2].frameWidth = (pMStack_10->pic_head).forward_f_code;
  pfw[2].frameHeight = (pMStack_10->pic_head).full_pel_backward_vector;
  pfw[2].mb_width = (pMStack_10->pic_head).backward_f_code;
  pfw[2].mb_height = (pMStack_10->pic_head).pre_temporal_reference;
  pfw[2].vlcSet = (pMStack_10->seq_disp_ext_head).video_format;
  pfw[2].qp = (pMStack_10->seq_disp_ext_head).color_description;
  pfw[2].frame_codelen = (pMStack_10->seq_disp_ext_head).color_primaries;
  *(RK_S32 *)&pfw[2].field_0x2c = (pMStack_10->seq_disp_ext_head).transfer_characteristics;
  *(RK_S32 *)&pfw[2].f = (pMStack_10->seq_disp_ext_head).matrix_coefficients;
  *(RK_S32 (*) [2])((long)&pfw[2].f + 4) = (pMStack_10->pic_code_ext_head).f_code[0];
  *(RK_S32 (*) [2])&pfw[2].slot_index = (pMStack_10->pic_code_ext_head).f_code[1];
  pfw[3].tr = (pMStack_10->pic_code_ext_head).intra_dc_precision;
  pfw[3].picCodingType = (pMStack_10->pic_code_ext_head).picture_structure;
  pfw[3].totalMbInFrame = (pMStack_10->pic_code_ext_head).top_field_first;
  pfw[3].frameWidth = (pMStack_10->pic_code_ext_head).frame_pred_frame_dct;
  pfw[3].frameHeight = (pMStack_10->pic_code_ext_head).concealment_motion_vectors;
  pfw[3].mb_width = (pMStack_10->pic_code_ext_head).q_scale_type;
  pfw[3].mb_height = (pMStack_10->pic_code_ext_head).intra_vlc_format;
  pfw[3].vlcSet = (pMStack_10->pic_code_ext_head).alternate_scan;
  pfw[3].qp = (pMStack_10->pic_code_ext_head).repeat_first_field;
  pfw[3].frame_codelen = (pMStack_10->pic_code_ext_head).chroma_420_type;
  *(RK_S32 *)&pfw[3].field_0x2c = (pMStack_10->pic_code_ext_head).progressive_frame;
  *(RK_S32 *)&pfw[3].f = (pMStack_10->pic_code_ext_head).composite_display_flag;
  *(RK_S32 *)((long)&pfw[3].f + 4) = (pMStack_10->pic_code_ext_head).v_axis;
  pfw[3].flags = (pMStack_10->pic_code_ext_head).field_sequence;
  pfw[3].slot_index = (pMStack_10->pic_code_ext_head).sub_carrier;
  pfw[4].frameNumber = (pMStack_10->pic_code_ext_head).burst_amplitude;
  pfw[4].tr = (pMStack_10->pic_code_ext_head).sub_carrier_phase;
  RVar1 = (pMStack_10->pic_disp_ext_head).frame_center_horizontal_offset[1];
  pfw[4].picCodingType = (pMStack_10->pic_disp_ext_head).frame_center_horizontal_offset[0];
  pfw[4].totalMbInFrame = RVar1;
  pfw[4].frameWidth = (pMStack_10->pic_disp_ext_head).frame_center_horizontal_offset[2];
  RVar1 = (pMStack_10->pic_disp_ext_head).frame_center_vertical_offset[1];
  pfw[4].frameHeight = (pMStack_10->pic_disp_ext_head).frame_center_vertical_offset[0];
  pfw[4].mb_width = RVar1;
  pfw[4].mb_height = (pMStack_10->pic_disp_ext_head).frame_center_vertical_offset[2];
  pfw->frameNumber = pMStack_10->frame_size - ((int)frame0._4_4_ >> 3 & 0xfffffff8U);
  pfw->picCodingType = (int)frame0._4_4_ >> 3 & 0xfffffff8;
  pfw->tr = frame0._4_4_ & 0x3f;
  *(RK_U8 **)&pfw->frameWidth = pMStack_10->qp_tab_sw_buf;
  *(byte *)&pfw->mb_width =
       (byte)pfw->mb_width & 0x80 | (byte)pMStack_10->frame_cur->slot_index & 0x7f;
  pMStack_10->cur_slot_index = pMStack_10->frame_cur->slot_index;
  if (pMStack_10->frame_ref0->slot_index < 0) {
    bx = (BitReadCtx_t *)pMStack_10->frame_cur;
  }
  if (pMStack_10->frame_ref1->slot_index < 0) {
    pbw = (M2VDFrameHead *)bx;
  }
  for (readbits = 0; (uint)readbits < 4; readbits = readbits + 1) {
    *(undefined1 *)((long)&pfw->mb_width + (ulong)(uint)readbits + 1) = 0xff;
  }
  if ((pMStack_10->pic_head).picture_coding_type == 3) {
    frame1 = (MppFrame)0x0;
    frame = (MppFrame)0x0;
    *(byte *)((long)&pfw->mb_width + 1) =
         *(byte *)((long)&pfw->mb_width + 1) & 0x80 | (byte)pbw->slot_index & 0x7f;
    *(byte *)((long)&pfw->mb_width + 2) =
         *(byte *)((long)&pfw->mb_width + 2) & 0x80 | (byte)pbw->slot_index & 0x7f;
    *(byte *)((long)&pfw->mb_width + 3) =
         *(byte *)((long)&pfw->mb_width + 3) & 0x80 |
         (byte)*(undefined4 *)((long)&bx->buf + 4) & 0x7f;
    *(byte *)&pfw->mb_height =
         (byte)pfw->mb_height & 0x80 | (byte)*(undefined4 *)((long)&bx->buf + 4) & 0x7f;
    mpp_buf_slot_get_prop(pMStack_10->frame_slots,pbw->slot_index,SLOT_FRAME_PTR,&frame1);
    mpp_buf_slot_get_prop
              (pMStack_10->frame_slots,*(RK_S32 *)((long)&bx->buf + 4),SLOT_FRAME_PTR,&frame);
    RVar2 = mpp_frame_get_errinfo(frame1);
    RVar3 = mpp_frame_get_errinfo(frame);
    local_40 = RVar2 | RVar3;
  }
  else {
    frame_1 = (MppFrame)0x0;
    if ((((pMStack_10->pic_code_ext_head).picture_structure == 3) ||
        (((pMStack_10->pic_code_ext_head).picture_structure == 1 &&
         ((pMStack_10->pic_code_ext_head).top_field_first != 0)))) ||
       (((pMStack_10->pic_code_ext_head).picture_structure == 2 &&
        ((pMStack_10->pic_code_ext_head).top_field_first == 0)))) {
      *(byte *)((long)&pfw->mb_width + 1) =
           *(byte *)((long)&pfw->mb_width + 1) & 0x80 |
           (byte)*(undefined4 *)((long)&bx->buf + 4) & 0x7f;
      *(byte *)((long)&pfw->mb_width + 2) =
           *(byte *)((long)&pfw->mb_width + 2) & 0x80 |
           (byte)*(undefined4 *)((long)&bx->buf + 4) & 0x7f;
    }
    else if ((pMStack_10->pic_code_ext_head).picture_structure == 1) {
      *(byte *)((long)&pfw->mb_width + 1) =
           *(byte *)((long)&pfw->mb_width + 1) & 0x80 |
           (byte)*(undefined4 *)((long)&bx->buf + 4) & 0x7f;
      *(byte *)((long)&pfw->mb_width + 2) =
           *(byte *)((long)&pfw->mb_width + 2) & 0x80 |
           (byte)pMStack_10->frame_cur->slot_index & 0x7f;
    }
    else if ((pMStack_10->pic_code_ext_head).picture_structure == 2) {
      *(byte *)((long)&pfw->mb_width + 1) =
           *(byte *)((long)&pfw->mb_width + 1) & 0x80 |
           (byte)pMStack_10->frame_cur->slot_index & 0x7f;
      *(byte *)((long)&pfw->mb_width + 2) =
           *(byte *)((long)&pfw->mb_width + 2) & 0x80 |
           (byte)*(undefined4 *)((long)&bx->buf + 4) & 0x7f;
    }
    *(byte *)((long)&pfw->mb_width + 3) =
         *(byte *)((long)&pfw->mb_width + 3) & 0x80 | (byte)pMStack_10->frame_cur->slot_index & 0x7f
    ;
    *(byte *)&pfw->mb_height =
         (byte)pfw->mb_height & 0x80 | (byte)pMStack_10->frame_cur->slot_index & 0x7f;
    mpp_buf_slot_get_prop
              (pMStack_10->frame_slots,*(RK_S32 *)((long)&bx->buf + 4),SLOT_FRAME_PTR,&frame_1);
    local_40 = mpp_frame_get_errinfo(frame_1);
  }
  if (pMStack_10->frame_cur->picCodingType == 1) {
    local_40 = 0;
  }
  pfw->vlcSet = pMStack_10->MPEG2_Flag;
  local_68 = (MppFrame)0x0;
  mpp_buf_slot_get_prop(pMStack_10->frame_slots,pMStack_10->cur_slot_index,SLOT_FRAME_PTR,&local_68)
  ;
  mpp_frame_set_errinfo(local_68,local_40);
  if ((m2vd_debug & 1) != 0) {
    _mpp_log_l(4,"m2vd_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_O",0x5ba,
               "m2vd_convert_to_dxva");
  }
  return dst._4_4_;
}

Assistant:

static MPP_RET m2vd_convert_to_dxva(M2VDParserContext *p)
{
    MPP_RET ret = MPP_OK;
    m2vd_dbg_func("FUN_I");
    M2VDDxvaParam *dst = p->dxva_ctx;
    M2VDFrameHead *pfw = p->frame_ref1;
    M2VDFrameHead *pbw = p->frame_ref0;
    BitReadCtx_t *bx = p->bitread_ctx;
    RK_U32 i = 0;
    RK_U32 error_info = 0;

    RK_S32 readbits = m2vd_get_readbits(bx);

    dst->seq.decode_width                       = p->seq_head.decode_width;
    dst->seq.decode_height                      = p->seq_head.decode_height;
    dst->seq.aspect_ratio_information           = p->seq_head.aspect_ratio_information;
    dst->seq.frame_rate_code                    = p->seq_head.frame_rate_code;
    dst->seq.bit_rate_value                     = p->seq_head.bit_rate_value;
    dst->seq.vbv_buffer_size                    = p->seq_head.vbv_buffer_size;
    dst->seq.constrained_parameters_flag        = p->seq_head.constrained_parameters_flag;
    dst->seq.load_intra_quantizer_matrix        = p->seq_head.load_intra_quantizer_matrix;
    dst->seq.load_non_intra_quantizer_matrix    = p->seq_head.load_non_intra_quantizer_matrix;

    dst->seq_ext.profile_and_level_indication   = p->seq_ext_head.profile_and_level_indication;
    dst->seq_ext.progressive_sequence           = p->seq_ext_head.progressive_sequence;
    dst->seq_ext.chroma_format                  = p->seq_ext_head.chroma_format;
    dst->seq_ext.low_delay                      = p->seq_ext_head.low_delay;
    dst->seq_ext.frame_rate_extension_n         = p->seq_ext_head.frame_rate_extension_n;
    dst->seq_ext.frame_rate_extension_d         = p->seq_ext_head.frame_rate_extension_d;


    dst->gop.drop_flag           = p->gop_head.drop_flag;
    dst->gop.hour                = p->gop_head.hour;
    dst->gop.minute              = p->gop_head.minute;
    dst->gop.sec                 = p->gop_head.sec;
    dst->gop.frame               = p->gop_head.frame;
    dst->gop.closed_gop          = p->gop_head.closed_gop;
    dst->gop.broken_link         = p->gop_head.broken_link;


    dst->pic.temporal_reference             = p->pic_head.temporal_reference;
    dst->pic.picture_coding_type            = p->pic_head.picture_coding_type;
    dst->pic.pre_picture_coding_type        = p->pic_head.pre_picture_coding_type;
    dst->pic.vbv_delay                      = p->pic_head.vbv_delay;
    dst->pic.full_pel_forward_vector        = p->pic_head.full_pel_forward_vector;
    dst->pic.forward_f_code                 = p->pic_head.forward_f_code;
    dst->pic.full_pel_backward_vector       = p->pic_head.full_pel_backward_vector;
    dst->pic.backward_f_code                = p->pic_head.backward_f_code;
    dst->pic.pre_temporal_reference         = p->pic_head.pre_temporal_reference;

    dst->seq_disp_ext.video_format              = p->seq_disp_ext_head.video_format;
    dst->seq_disp_ext.color_description         = p->seq_disp_ext_head.color_description;
    dst->seq_disp_ext.color_primaries           = p->seq_disp_ext_head.color_primaries;
    dst->seq_disp_ext.transfer_characteristics  = p->seq_disp_ext_head.transfer_characteristics;
    dst->seq_disp_ext.matrix_coefficients       = p->seq_disp_ext_head.matrix_coefficients;

    memcpy(dst->pic_code_ext.f_code, p->pic_code_ext_head.f_code, 2 * 2 * sizeof(RK_S32));
    dst->pic_code_ext.intra_dc_precision            = p->pic_code_ext_head.intra_dc_precision;
    dst->pic_code_ext.picture_structure             = p->pic_code_ext_head.picture_structure;
    dst->pic_code_ext.top_field_first               = p->pic_code_ext_head.top_field_first;
    dst->pic_code_ext.frame_pred_frame_dct          = p->pic_code_ext_head.frame_pred_frame_dct;
    dst->pic_code_ext.concealment_motion_vectors    = p->pic_code_ext_head.concealment_motion_vectors;
    dst->pic_code_ext.q_scale_type                  = p->pic_code_ext_head.q_scale_type;
    dst->pic_code_ext.intra_vlc_format              = p->pic_code_ext_head.intra_vlc_format;
    dst->pic_code_ext.alternate_scan                = p->pic_code_ext_head.alternate_scan;
    dst->pic_code_ext.repeat_first_field            = p->pic_code_ext_head.repeat_first_field;
    dst->pic_code_ext.chroma_420_type               = p->pic_code_ext_head.chroma_420_type;
    dst->pic_code_ext.progressive_frame             = p->pic_code_ext_head.progressive_frame;
    dst->pic_code_ext.composite_display_flag        = p->pic_code_ext_head.composite_display_flag;
    dst->pic_code_ext.v_axis                        = p->pic_code_ext_head.v_axis;
    dst->pic_code_ext.field_sequence                = p->pic_code_ext_head.field_sequence;
    dst->pic_code_ext.sub_carrier                   = p->pic_code_ext_head.sub_carrier;
    dst->pic_code_ext.burst_amplitude               = p->pic_code_ext_head.burst_amplitude;
    dst->pic_code_ext.sub_carrier_phase             = p->pic_code_ext_head.sub_carrier_phase;

    memcpy(dst->pic_disp_ext.frame_center_horizontal_offset, p->pic_disp_ext_head.frame_center_horizontal_offset, 3 * sizeof(RK_S32));
    memcpy(dst->pic_disp_ext.frame_center_vertical_offset, p->pic_disp_ext_head.frame_center_vertical_offset, 3 * sizeof(RK_S32));

    dst->bitstream_length = p->frame_size - ((readbits >> 3) & (~7));
    dst->bitstream_offset = ((readbits >> 3) & (~7));
    dst->bitstream_start_bit = readbits & 0x3f;
    dst->qp_tab = p->qp_tab_sw_buf;
    dst->CurrPic.Index7Bits = p->frame_cur->slot_index;
    p->cur_slot_index = p->frame_cur->slot_index;

    if (p->frame_ref0->slot_index < 0)
        pbw = p->frame_cur;

    if (p->frame_ref1->slot_index < 0)
        pfw = pbw;

    for (i = 0; i < 4; i++) {
        dst->frame_refs[i].bPicEntry = 0xff;
    }
    if (p->pic_head.picture_coding_type == M2VD_CODING_TYPE_B) {
        MppFrame frame0 = NULL;
        MppFrame frame1 = NULL;
        dst->frame_refs[0].Index7Bits = pfw->slot_index;
        dst->frame_refs[1].Index7Bits = pfw->slot_index;
        dst->frame_refs[2].Index7Bits = pbw->slot_index;
        dst->frame_refs[3].Index7Bits = pbw->slot_index;
        mpp_buf_slot_get_prop(p->frame_slots, pfw->slot_index, SLOT_FRAME_PTR, &frame0);
        mpp_buf_slot_get_prop(p->frame_slots, pbw->slot_index, SLOT_FRAME_PTR, &frame1);
        error_info = mpp_frame_get_errinfo(frame0) | mpp_frame_get_errinfo(frame1);
    } else {
        MppFrame frame = NULL;
        if ((p->pic_code_ext_head.picture_structure == M2VD_PIC_STRUCT_FRAME) ||
            ((p->pic_code_ext_head.picture_structure == M2VD_PIC_STRUCT_TOP_FIELD) && p->pic_code_ext_head.top_field_first) ||
            ((p->pic_code_ext_head.picture_structure == M2VD_PIC_STRUCT_BOTTOM_FIELD) && (!p->pic_code_ext_head.top_field_first))) {
            dst->frame_refs[0].Index7Bits = pbw->slot_index;
            dst->frame_refs[1].Index7Bits = pbw->slot_index;
        } else if (p->pic_code_ext_head.picture_structure == M2VD_PIC_STRUCT_TOP_FIELD) {
            dst->frame_refs[0].Index7Bits = pbw->slot_index;
            dst->frame_refs[1].Index7Bits = p->frame_cur->slot_index;
        } else if (p->pic_code_ext_head.picture_structure == M2VD_PIC_STRUCT_BOTTOM_FIELD) {
            dst->frame_refs[0].Index7Bits = p->frame_cur->slot_index;
            dst->frame_refs[1].Index7Bits = pbw->slot_index;
        }
        dst->frame_refs[2].Index7Bits = p->frame_cur->slot_index;
        dst->frame_refs[3].Index7Bits = p->frame_cur->slot_index;
        mpp_buf_slot_get_prop(p->frame_slots, pbw->slot_index, SLOT_FRAME_PTR, &frame);
        error_info = mpp_frame_get_errinfo(frame);
    }
    if (p->frame_cur->picCodingType == M2VD_CODING_TYPE_I) {
        error_info = 0;
    }
    dst->seq_ext_head_dec_flag = p->MPEG2_Flag;
    {
        MppFrame frame = NULL;
        mpp_buf_slot_get_prop(p->frame_slots, p->cur_slot_index, SLOT_FRAME_PTR, &frame);
        mpp_frame_set_errinfo(frame, error_info);
    }
    m2vd_dbg_func("FUN_O");
    return ret;
}